

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_str(Context *context,IntrinsicResult partialResult)

{
  Value local_58;
  undefined1 local_48 [32];
  String local_28;
  
  String::String(&local_28,"x");
  Context::GetVar((Context *)local_48,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  Value::ToString((Value *)(local_48 + 0x10),(Machine *)local_48);
  local_58.type = String;
  local_58.noInvoke = false;
  local_58.localOnly = Off;
  if ((RefCountedStorage *)local_48._16_8_ == (RefCountedStorage *)0x0) {
    local_48._16_8_ = Value::emptyString._8_8_;
  }
  if ((RefCountedStorage *)local_48._16_8_ != (RefCountedStorage *)0x0) {
    ((RefCountedStorage *)local_48._16_8_)->refCount =
         ((RefCountedStorage *)local_48._16_8_)->refCount + 1;
  }
  local_58.data = (anon_union_8_3_2f476f46_for_data)local_48._16_8_;
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_58,true);
  Value::~Value(&local_58);
  String::~String((String *)(local_48 + 0x10));
  Value::~Value((Value *)local_48);
  String::~String(&local_28);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_str(Context *context, IntrinsicResult partialResult) {
		return IntrinsicResult(context->GetVar("x").ToString());
	}